

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::on_i2p_open(session_impl *this,error_code *ec)

{
  uint uVar1;
  long *local_38 [2];
  long local_28 [2];
  
  if (ec->failed_ == true) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 1) != 0) {
      alert_manager::emplace_alert<libtorrent::i2p_alert,boost::system::error_code_const&>
                (&this->m_alerts,ec);
    }
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      uVar1 = ec->val_;
      (*ec->cat_->_vptr_error_category[4])(local_38,ec->cat_,(ulong)uVar1);
      session_log(this,"i2p open failed (%d) %s",(ulong)uVar1,local_38[0]);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
  }
  open_new_incoming_i2p_connection(this);
  return;
}

Assistant:

void session_impl::on_i2p_open(error_code const& ec)
	{
		if (ec)
		{
			if (m_alerts.should_post<i2p_alert>())
				m_alerts.emplace_alert<i2p_alert>(ec);

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
				session_log("i2p open failed (%d) %s", ec.value(), ec.message().c_str());
#endif
		}
		// now that we have our i2p connection established
		// it's OK to start torrents and use this socket to
		// do i2p name lookups

		open_new_incoming_i2p_connection();
	}